

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UBool repTextAccess(UText *ut,int64_t index,UBool forward)

{
  Replaceable *this;
  int32_t iVar1;
  int32_t iVar2;
  undefined1 local_80 [8];
  UnicodeString buffer;
  ReplExtra *ex;
  int32_t index32;
  int32_t length;
  Replaceable *rep;
  int64_t iStack_20;
  UBool forward_local;
  int64_t index_local;
  UText *ut_local;
  
  this = (Replaceable *)ut->context;
  iStack_20 = index;
  index_local = (int64_t)ut;
  iVar1 = icu_63::Replaceable::length(this);
  iVar2 = pinIndex(&stack0xffffffffffffffe0,(long)iVar1);
  if (forward == '\0') {
    if ((*(long *)(index_local + 0x20) < (long)iVar2) &&
       ((long)iVar2 <= *(long *)(index_local + 0x10))) {
      *(int32_t *)(index_local + 0x28) = iVar2 - (int)*(undefined8 *)(index_local + 0x20);
      return '\x01';
    }
    if ((iVar2 == 0) && (*(long *)(index_local + 0x20) == 0)) {
      *(undefined4 *)(index_local + 0x28) = 0;
      return '\0';
    }
    *(long *)(index_local + 0x20) = (long)(iVar2 + -9);
    if (*(long *)(index_local + 0x20) < 0) {
      *(undefined8 *)(index_local + 0x20) = 0;
    }
    *(long *)(index_local + 0x10) = (long)(iVar2 + 1);
    if ((long)iVar1 < *(long *)(index_local + 0x10)) {
      *(long *)(index_local + 0x10) = (long)iVar1;
    }
  }
  else {
    if ((*(long *)(index_local + 0x20) <= (long)iVar2) &&
       ((long)iVar2 < *(long *)(index_local + 0x10))) {
      *(int *)(index_local + 0x28) = (int)iStack_20 - (int)*(undefined8 *)(index_local + 0x20);
      return '\x01';
    }
    if ((iVar1 <= iVar2) && (*(long *)(index_local + 0x10) == (long)iVar1)) {
      *(int32_t *)(index_local + 0x28) = iVar1 - (int)*(undefined8 *)(index_local + 0x20);
      return '\0';
    }
    *(int64_t *)(index_local + 0x10) = iStack_20 + 9;
    if ((long)iVar1 < *(long *)(index_local + 0x10)) {
      *(long *)(index_local + 0x10) = (long)iVar1;
    }
    *(long *)(index_local + 0x20) = *(long *)(index_local + 0x10) + -10;
    if (*(long *)(index_local + 0x20) < 0) {
      *(undefined8 *)(index_local + 0x20) = 0;
    }
  }
  buffer.fUnion._48_8_ = *(undefined8 *)(index_local + 0x40);
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_80,(UChar *)buffer.fUnion._48_8_,0,10)
  ;
  (*(this->super_UObject)._vptr_UObject[3])
            (this,(ulong)*(uint *)(index_local + 0x20),(ulong)*(uint *)(index_local + 0x10),
             (UnicodeString *)local_80);
  *(undefined8 *)(index_local + 0x30) = buffer.fUnion._48_8_;
  *(int *)(index_local + 0x2c) =
       (int)*(undefined8 *)(index_local + 0x10) - (int)*(undefined8 *)(index_local + 0x20);
  *(int32_t *)(index_local + 0x28) = iVar2 - (int)*(undefined8 *)(index_local + 0x20);
  if ((*(long *)(index_local + 0x10) < (long)iVar1) &&
     ((*(ushort *)(buffer.fUnion._48_8_ + (long)(*(int *)(index_local + 0x2c) + -1) * 2) & 0xfc00)
      == 0xd800)) {
    *(int *)(index_local + 0x2c) = *(int *)(index_local + 0x2c) + -1;
    *(long *)(index_local + 0x10) = *(long *)(index_local + 0x10) + -1;
    if (*(int *)(index_local + 0x2c) < *(int *)(index_local + 0x28)) {
      *(undefined4 *)(index_local + 0x28) = *(undefined4 *)(index_local + 0x2c);
    }
  }
  if ((0 < *(long *)(index_local + 0x20)) && ((*(ushort *)buffer.fUnion._48_8_ & 0xfc00) == 0xdc00))
  {
    *(long *)(index_local + 0x30) = *(long *)(index_local + 0x30) + 2;
    *(long *)(index_local + 0x20) = *(long *)(index_local + 0x20) + 1;
    *(int *)(index_local + 0x2c) = *(int *)(index_local + 0x2c) + -1;
    *(int *)(index_local + 0x28) = *(int *)(index_local + 0x28) + -1;
  }
  if ((((*(ushort *)(*(long *)(index_local + 0x30) + (long)*(int *)(index_local + 0x28) * 2) &
        0xfc00) == 0xdc00) && (0 < *(int *)(index_local + 0x28))) &&
     ((*(ushort *)(*(long *)(index_local + 0x30) + (long)(*(int *)(index_local + 0x28) + -1) * 2) &
      0xfc00) == 0xd800)) {
    *(int *)(index_local + 0x28) = *(int *)(index_local + 0x28) + -1;
  }
  *(undefined4 *)(index_local + 0x1c) = *(undefined4 *)(index_local + 0x2c);
  ut_local._7_1_ = '\x01';
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_80);
  return ut_local._7_1_;
}

Assistant:

static UBool U_CALLCONV
repTextAccess(UText *ut, int64_t index, UBool forward) {
    const Replaceable *rep=(const Replaceable *)ut->context;
    int32_t length=rep->length();   // Full length of the input text (bigger than a chunk)

    // clip the requested index to the limits of the text.
    int32_t index32 = pinIndex(index, length);
    U_ASSERT(index<=INT32_MAX);


    /*
     * Compute start/limit boundaries around index, for a segment of text
     * to be extracted.
     * To allow for the possibility that our user gave an index to the trailing
     * half of a surrogate pair, we must request one extra preceding UChar when
     * going in the forward direction.  This will ensure that the buffer has the
     * entire code point at the specified index.
     */
    if(forward) {

        if (index32>=ut->chunkNativeStart && index32<ut->chunkNativeLimit) {
            // Buffer already contains the requested position.
            ut->chunkOffset = (int32_t)(index - ut->chunkNativeStart);
            return TRUE;
        }
        if (index32>=length && ut->chunkNativeLimit==length) {
            // Request for end of string, and buffer already extends up to it.
            // Can't get the data, but don't change the buffer.
            ut->chunkOffset = length - (int32_t)ut->chunkNativeStart;
            return FALSE;
        }

        ut->chunkNativeLimit = index + REP_TEXT_CHUNK_SIZE - 1;
        // Going forward, so we want to have the buffer with stuff at and beyond
        //   the requested index.  The -1 gets us one code point before the
        //   requested index also, to handle the case of the index being on
        //   a trail surrogate of a surrogate pair.
        if(ut->chunkNativeLimit > length) {
            ut->chunkNativeLimit = length;
        }
        // unless buffer ran off end, start is index-1.
        ut->chunkNativeStart = ut->chunkNativeLimit - REP_TEXT_CHUNK_SIZE;
        if(ut->chunkNativeStart < 0) {
            ut->chunkNativeStart = 0;
        }
    } else {
        // Reverse iteration.  Fill buffer with data preceding the requested index.
        if (index32>ut->chunkNativeStart && index32<=ut->chunkNativeLimit) {
            // Requested position already in buffer.
            ut->chunkOffset = index32 - (int32_t)ut->chunkNativeStart;
            return TRUE;
        }
        if (index32==0 && ut->chunkNativeStart==0) {
            // Request for start, buffer already begins at start.
            //  No data, but keep the buffer as is.
            ut->chunkOffset = 0;
            return FALSE;
        }

        // Figure out the bounds of the chunk to extract for reverse iteration.
        // Need to worry about chunk not splitting surrogate pairs, and while still
        // containing the data we need.
        // Fix by requesting a chunk that includes an extra UChar at the end.
        // If this turns out to be a lead surrogate, we can lop it off and still have
        //   the data we wanted.
        ut->chunkNativeStart = index32 + 1 - REP_TEXT_CHUNK_SIZE;
        if (ut->chunkNativeStart < 0) {
            ut->chunkNativeStart = 0;
        }

        ut->chunkNativeLimit = index32 + 1;
        if (ut->chunkNativeLimit > length) {
            ut->chunkNativeLimit = length;
        }
    }

    // Extract the new chunk of text from the Replaceable source.
    ReplExtra *ex = (ReplExtra *)ut->pExtra;
    // UnicodeString with its buffer a writable alias to the chunk buffer
    UnicodeString buffer(ex->s, 0 /*buffer length*/, REP_TEXT_CHUNK_SIZE /*buffer capacity*/);
    rep->extractBetween((int32_t)ut->chunkNativeStart, (int32_t)ut->chunkNativeLimit, buffer);

    ut->chunkContents  = ex->s;
    ut->chunkLength    = (int32_t)(ut->chunkNativeLimit - ut->chunkNativeStart);
    ut->chunkOffset    = (int32_t)(index32 - ut->chunkNativeStart);

    // Surrogate pairs from the input text must not span chunk boundaries.
    // If end of chunk could be the start of a surrogate, trim it off.
    if (ut->chunkNativeLimit < length &&
        U16_IS_LEAD(ex->s[ut->chunkLength-1])) {
            ut->chunkLength--;
            ut->chunkNativeLimit--;
            if (ut->chunkOffset > ut->chunkLength) {
                ut->chunkOffset = ut->chunkLength;
            }
        }

    // if the first UChar in the chunk could be the trailing half of a surrogate pair,
    // trim it off.
    if(ut->chunkNativeStart>0 && U16_IS_TRAIL(ex->s[0])) {
        ++(ut->chunkContents);
        ++(ut->chunkNativeStart);
        --(ut->chunkLength);
        --(ut->chunkOffset);
    }

    // adjust the index/chunkOffset to a code point boundary
    U16_SET_CP_START(ut->chunkContents, 0, ut->chunkOffset);

    // Use fast indexing for get/setNativeIndex()
    ut->nativeIndexingLimit = ut->chunkLength;

    return TRUE;
}